

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_set.c
# Opt level: O0

int mpt_command_set(mpt_array *arr,uintptr_t id,_func_int_void_ptr_void_ptr *cmd,void *arg)

{
  mpt_command *pmVar1;
  mpt_buffer *pmVar2;
  mpt_type_traits *pmVar3;
  ulong elem;
  size_t len;
  mpt_command *dest;
  mpt_buffer *buf;
  void *arg_local;
  _func_int_void_ptr_void_ptr *cmd_local;
  uintptr_t id_local;
  mpt_array *arr_local;
  
  pmVar1 = mpt_command_get(arr,id);
  if (pmVar1 != (mpt_command *)0x0) {
    (*pmVar1->cmd)(pmVar1->arg,(void *)0x0);
    pmVar1->cmd = cmd;
    pmVar1->arg = arg;
    if (cmd == (_func_int_void_ptr_void_ptr *)0x0) {
      return 2;
    }
    return 0;
  }
  pmVar2 = arr->_buf;
  if (pmVar2 == (mpt_buffer *)0x0) {
    pmVar2 = _mpt_buffer_alloc(0x18,2);
    if (pmVar2 == (mpt_buffer *)0x0) {
      return -4;
    }
    pmVar3 = mpt_command_traits();
    pmVar2->_content_traits = pmVar3;
    arr->_buf = pmVar2;
    len = (size_t)mpt_buffer_insert(pmVar2,0,0x18);
    if ((void *)len == (void *)0x0) {
      return -4;
    }
  }
  else {
    elem = pmVar2->_used / 0x18;
    if ((elem != 0) &&
       (pmVar1 = mpt_command_empty((mpt_command *)(pmVar2 + 1),elem), pmVar1 != (mpt_command *)0x0))
    {
      pmVar1->id = id;
      pmVar1->cmd = cmd;
      pmVar1->arg = arg;
      return 0;
    }
    len = (size_t)mpt_array_insert(arr,pmVar2->_used,0x18);
    if ((void *)len == (void *)0x0) {
      return -4;
    }
  }
  *(uintptr_t *)len = id;
  *(_func_int_void_ptr_void_ptr **)(len + 8) = cmd;
  *(void **)(len + 0x10) = arg;
  return 1;
}

Assistant:

extern int mpt_command_set(_MPT_UARRAY_TYPE(command) *arr, uintptr_t id, int (*cmd)(void *, void *), void *arg)
{
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(command) *dest;
	
	/* replace/delete command */
	if ((dest = mpt_command_get(arr, id))) {
		dest->cmd(dest->arg, 0);
		dest->cmd = cmd;
		dest->arg = arg;
		return cmd ? 0 : 2;
	}
	if (!(buf = arr->_buf)) {
		/* reject copy (command has singular context reference!) */
		if (!(buf = _mpt_buffer_alloc(sizeof(*dest), MPT_ENUM(BufferNoCopy)))) {
			return MPT_ERROR(BadOperation);
		}
		buf->_content_traits = mpt_command_traits();
		arr->_buf = buf;
		if (!(dest = mpt_buffer_insert(buf, 0, sizeof(*dest)))) {
			return MPT_ERROR(BadOperation);
		}
	}
	else {
		size_t len = buf->_used / sizeof(*dest);
		
		/* place in empty area */
		if (len && (dest = mpt_command_empty((void *) (buf + 1), len))) {
			dest->id = id;
			dest->cmd = cmd;
			dest->arg = arg;
			return 0;
		}
		/* append command data */
		if (!(dest = mpt_array_insert(arr, buf->_used, sizeof(*dest)))) {
			return MPT_ERROR(BadOperation);
		}
	}
	dest->id = id;
	dest->cmd = cmd;
	dest->arg = arg;
	
	return 1;
}